

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_serializer_test.cc
# Opt level: O2

void __thiscall
prometheus::anon_unknown_0::TextSerializerTest_shouldSerializeHistogram_Test::
~TextSerializerTest_shouldSerializeHistogram_Test
          (TextSerializerTest_shouldSerializeHistogram_Test *this)

{
  TextSerializerTest::~TextSerializerTest(&this->super_TextSerializerTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TextSerializerTest, shouldSerializeHistogram) {
  Histogram histogram{{1}};
  histogram.Observe(0);
  histogram.Observe(200);
  metric = histogram.Collect();

  const auto serialized = Serialize(MetricType::Histogram);
  EXPECT_THAT(serialized, testing::HasSubstr(name + "_count 2\n"));
  EXPECT_THAT(serialized, testing::HasSubstr(name + "_sum 200\n"));
  EXPECT_THAT(serialized, testing::HasSubstr(name + "_bucket{le=\"1\"} 1\n"));
  EXPECT_THAT(serialized,
              testing::HasSubstr(name + "_bucket{le=\"+Inf\"} 2\n"));
}